

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<wasm::Type> *
wasm::WATParser::elemlist<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Type> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,bool legacy)

{
  _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *p_Var1;
  _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *this;
  undefined1 *puVar2;
  undefined8 *puVar3;
  _Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *this_00;
  _Uninitialized<wasm::Type,_true> _Var4;
  bool bVar5;
  string_view expected;
  string local_e8;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [8];
  MaybeResult<wasm::Type> type;
  MaybeResult<wasm::Ok> func;
  MaybeResult<wasm::Ok> _val;
  
  maybeReftype<wasm::WATParser::ParseModuleTypesCtx>((MaybeResult<wasm::Type> *)local_a8,ctx);
  if (type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
    expected._M_str = "func";
    expected._M_len = 4;
    bVar5 = Lexer::takeKeyword(&ctx->in,expected);
    if (!bVar5 && !legacy) {
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_a8);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"expected element list","");
      Lexer::err((Err *)local_a8,&ctx->in,&local_e8);
      puVar3 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err> = puVar3;
      _Var4._M_storage.id =
           (Type)((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 8);
      if ((Type)local_a8 == _Var4._M_storage.id) {
        *puVar3 = CONCAT71(type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u.
                           _9_7_,type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 _M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x18) =
             type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err> = local_a8;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                          super__Move_assign_alias<wasm::Type,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10) =
             CONCAT71(type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._9_7_,
                      type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_);
      }
      ((_Uninitialized<wasm::Type,_true> *)
      ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::Err> + 8))->_M_storage =
           (Type)type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first.
                 _M_storage.id;
      type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first._M_storage.id =
           (_Uninitialized<wasm::Type,_true>)(Type)0x0;
      type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\x01';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
        return __return_storage_ptr__;
      }
      local_a8 = (undefined1  [8])_Var4;
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    p_Var1 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
             ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20);
    this = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
           ((long)&func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20);
    while (maybeFuncidx<wasm::WATParser::ParseModuleTypesCtx>((MaybeResult<wasm::Ok> *)p_Var1,ctx),
          func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ != '\x01') {
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)this,
                      (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)p_Var1);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
        local_c8 = &local_b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,
                   func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_,
                   _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ +
                   func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_);
LAB_00be43c1:
        puVar3 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err> = puVar3;
        if (local_c8 == &local_b8) {
          *puVar3 = local_b8;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x18) = uStack_b0;
        }
        else {
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err> = local_c8;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10) = local_b8;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::Err> + 8) = local_c0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\x01';
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                          ((long)&func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                          ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20))
        ;
        goto LAB_00be4475;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage(this);
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage(p_Var1);
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                      ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err> = 0x12;
  }
  else {
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                    ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20),
                    (_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_a8);
    if (func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      puVar2 = (undefined1 *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8);
      func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ = puVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                 type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._32_8_,
                 func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ +
                 type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._32_8_);
      puVar3 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err> = puVar3;
      if ((undefined1 *)
          func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ == puVar2) {
        *puVar3 = _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x18) =
             _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err> =
             func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10) =
             _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_8_;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err> + 8) =
           _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                        ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
      goto LAB_00be4475;
    }
    this_00 = (_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)
              ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20);
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
    ~_Variant_storage(this_00);
    p_Var1 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
             ((long)&func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20);
    while (maybeElemexpr<wasm::WATParser::ParseModuleTypesCtx>((MaybeResult<wasm::Ok> *)this_00,ctx)
          , func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ != '\x01') {
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)p_Var1,
                      (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)this_00);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
        local_c8 = &local_b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,
                   func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_,
                   _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ +
                   func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_);
        goto LAB_00be43c1;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage(p_Var1);
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)this_00);
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                      ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
    *(undefined1 (*) [8])
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err> = local_a8;
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\0';
LAB_00be4475:
  std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::ElemListT> elemlist(Ctx& ctx, bool legacy) {
  if (auto type = maybeReftype(ctx)) {
    CHECK_ERR(type);
    auto res = ctx.makeElemList(*type);
    while (auto elem = maybeElemexpr(ctx)) {
      CHECK_ERR(elem);
      ctx.appendElem(res, *elem);
    }
    return res;
  } else if (ctx.in.takeKeyword("func"sv) || legacy) {
    auto res = ctx.makeFuncElemList();
    while (auto func = maybeFuncidx(ctx)) {
      CHECK_ERR(func);
      ctx.appendFuncElem(res, *func);
    }
    return res;
  }
  return ctx.in.err("expected element list");
}